

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetInteger64Verifier::
verifyIntegerGreaterOrEqual2
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          GLint reference1)

{
  bool bVar1;
  qpTestResult qVar2;
  long (*palVar3) [2];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  long local_1f8;
  long local_1f0 [3];
  MessageBuilder local_1d8;
  undefined1 local_58 [8];
  StateQueryMemoryWriteGuard<long[2]> intVector2;
  GLint reference1_local;
  GLint reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  intVector2.m_postguard[1]._4_4_ = reference1;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long[2]> *)local_58);
  palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_58);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,*palVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long[2]> *)local_58,testCtx);
  if ((bVar1) &&
     ((palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58),
      (*palVar3)[0] < (long)reference0 ||
      (palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58),
      (*palVar3)[1] < (long)intVector2.m_postguard[1]._4_4_)))) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1d8,(char (*) [40])"// ERROR: expected greater or equal to ");
    local_1f0[0] = (long)reference0;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1f0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    local_1f8 = (long)intVector2.m_postguard[1]._4_4_;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2b8b5f6);
    palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*palVar3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*palVar3 + 1);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyIntegerGreaterOrEqual2 (tcu::TestContext& testCtx, GLenum name, GLint reference0, GLint reference1)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64[2]> intVector2;
	glGetInteger64v(name, intVector2);

	if (!intVector2.verifyValidity(testCtx))
		return;

	if (intVector2[0] < GLint64(reference0) || intVector2[1] < GLint64(reference1))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected greater or equal to " << GLint64(reference0) << ", " << GLint64(reference1) << "; got " << intVector2[0] << ", " << intVector2[1] << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}